

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pngrtran.c
# Opt level: O2

void png_set_quantize(png_structrp png_ptr,png_colorp palette,int num_palette,int maximum_colors,
                     png_const_uint_16p histogram,int full_quantize)

{
  png_bytep *pppVar1;
  byte bVar2;
  byte bVar3;
  png_byte pVar4;
  int iVar5;
  png_byte pVar6;
  png_byte pVar7;
  png_byte pVar8;
  int iVar9;
  uint uVar10;
  png_bytep ppVar11;
  ulong uVar12;
  undefined8 *puVar13;
  png_voidp pvVar14;
  uint uVar15;
  ulong uVar16;
  undefined8 *puVar17;
  uint uVar18;
  long lVar19;
  png_colorp ppVar20;
  png_colorp ppVar21;
  ulong uVar22;
  bool bVar23;
  byte bVar24;
  uint uVar25;
  byte *pbVar26;
  ulong uVar27;
  uint uVar28;
  ulong uVar29;
  int iVar30;
  byte bVar31;
  int iVar32;
  int iVar33;
  long lVar34;
  uint uVar35;
  png_byte *ppVar36;
  png_alloc_size_t size;
  uint uVar37;
  undefined4 uVar38;
  uint uVar39;
  png_color tmp_color;
  uint local_90;
  uint local_7c;
  long local_58;
  png_byte *local_50;
  
  iVar9 = png_rtran_ok(png_ptr,0);
  if (iVar9 != 0) {
    *(byte *)&png_ptr->transformations = (byte)png_ptr->transformations | 0x40;
    if (full_quantize == 0) {
      ppVar11 = (png_bytep)png_malloc(png_ptr,(long)num_palette);
      png_ptr->quantize_index = ppVar11;
      uVar12 = 0;
      uVar16 = 0;
      if (0 < num_palette) {
        uVar16 = (ulong)(uint)num_palette;
      }
      for (; uVar16 != uVar12; uVar12 = uVar12 + 1) {
        png_ptr->quantize_index[uVar12] = (png_byte)uVar12;
      }
    }
    if (maximum_colors < num_palette) {
      size = (png_alloc_size_t)num_palette;
      ppVar11 = (png_bytep)png_malloc(png_ptr,size);
      if (histogram == (png_const_uint_16p)0x0) {
        pppVar1 = &png_ptr->index_to_palette;
        png_ptr->index_to_palette = ppVar11;
        ppVar11 = (png_bytep)png_malloc(png_ptr,size);
        png_ptr->palette_to_index = ppVar11;
        uVar12 = 0;
        uVar16 = 0;
        if (0 < num_palette) {
          uVar16 = (ulong)(uint)num_palette;
        }
        for (; uVar16 != uVar12; uVar12 = uVar12 + 1) {
          png_ptr->index_to_palette[uVar12] = (png_byte)uVar12;
          png_ptr->palette_to_index[uVar12] = (png_byte)uVar12;
        }
        pvVar14 = png_calloc(png_ptr,0x1808);
        local_90 = 0x60;
        local_58 = 0x61;
        puVar13 = (undefined8 *)0x0;
        while (maximum_colors < num_palette) {
          local_7c = 1;
          uVar18 = local_7c;
          if (1 < num_palette) {
            uVar18 = num_palette;
          }
          uVar12 = 0;
          local_50 = &palette[1].blue;
          do {
            if (uVar12 == uVar18 - 1) {
              if (puVar13 != (undefined8 *)0x0) {
                lVar19 = 0;
                goto LAB_00110e70;
              }
              break;
            }
            ppVar21 = palette + uVar12;
            ppVar36 = local_50;
            for (uVar25 = local_7c; (int)uVar25 < num_palette; uVar25 = uVar25 + 1) {
              uVar37 = (uint)ppVar21->red - (uint)((png_color *)(ppVar36 + -2))->red;
              uVar35 = -uVar37;
              if (0 < (int)uVar37) {
                uVar35 = uVar37;
              }
              uVar10 = (uint)ppVar21->green - (uint)ppVar36[-1];
              uVar37 = -uVar10;
              if (0 < (int)uVar10) {
                uVar37 = uVar10;
              }
              uVar15 = (uint)ppVar21->blue - (uint)*ppVar36;
              uVar10 = -uVar15;
              if (0 < (int)uVar15) {
                uVar10 = uVar15;
              }
              uVar35 = (uVar10 & 0xff) + (uVar37 & 0xff) + (uVar35 & 0xff);
              if (uVar35 <= local_90) {
                puVar13 = (undefined8 *)png_malloc_warn(png_ptr,0x10);
                if (puVar13 == (undefined8 *)0x0) {
                  puVar13 = (undefined8 *)0x0;
                  goto LAB_00110e20;
                }
                *puVar13 = *(undefined8 *)((long)pvVar14 + (ulong)uVar35 * 8);
                *(char *)(puVar13 + 1) = (char)uVar12;
                *(char *)((long)puVar13 + 9) = (char)uVar25;
                *(undefined8 **)((long)pvVar14 + (ulong)uVar35 * 8) = puVar13;
              }
              ppVar36 = ppVar36 + 3;
            }
            local_7c = local_7c + 1;
            local_50 = local_50 + 3;
            uVar12 = uVar12 + 1;
          } while (puVar13 != (undefined8 *)0x0);
          puVar13 = (undefined8 *)0x0;
LAB_00110e20:
          for (lVar19 = 0; lVar19 != 0x301; lVar19 = lVar19 + 1) {
            puVar17 = *(undefined8 **)((long)pvVar14 + lVar19 * 8);
            if (puVar17 != (undefined8 *)0x0) {
              while (puVar17 != (undefined8 *)0x0) {
                puVar13 = (undefined8 *)*puVar17;
                png_free(png_ptr,puVar17);
                puVar17 = puVar13;
              }
            }
            *(undefined8 *)((long)pvVar14 + lVar19 * 8) = 0;
          }
          local_90 = local_90 + 0x60;
          local_58 = local_58 + 0x60;
        }
        png_free(png_ptr,pvVar14);
        png_free(png_ptr,png_ptr->palette_to_index);
        png_free(png_ptr,png_ptr->index_to_palette);
        *pppVar1 = (png_bytep)0x0;
        png_ptr->palette_to_index = (png_bytep)0x0;
        num_palette = maximum_colors;
      }
      else {
        png_ptr->quantize_sort = ppVar11;
        uVar16 = 0;
        uVar12 = 0;
        if (0 < num_palette) {
          uVar12 = (ulong)(uint)num_palette;
        }
        for (; uVar12 != uVar16; uVar16 = uVar16 + 1) {
          png_ptr->quantize_sort[uVar16] = (png_byte)uVar16;
        }
        do {
          if ((long)size <= (long)maximum_colors) break;
          size = size - 1;
          bVar23 = false;
          lVar19 = 0;
          while (lVar34 = lVar19, lVar34 < (long)size) {
            ppVar11 = png_ptr->quantize_sort;
            bVar31 = ppVar11[lVar34];
            lVar19 = lVar34 + 1;
            if (histogram[bVar31] < histogram[ppVar11[lVar34 + 1]]) {
              ppVar11[lVar34] = ppVar11[lVar34 + 1];
              png_ptr->quantize_sort[lVar19] = bVar31;
              bVar23 = true;
            }
          }
        } while (bVar23);
        if (full_quantize == 0) {
          uVar29 = 0;
          uVar16 = 0;
          if (0 < maximum_colors) {
            uVar16 = (ulong)(uint)maximum_colors;
          }
          for (; uVar29 != uVar16; uVar29 = uVar29 + 1) {
            if (maximum_colors <= (int)(uint)png_ptr->quantize_sort[uVar29]) {
              lVar19 = (long)num_palette;
              ppVar21 = palette + lVar19;
              do {
                ppVar20 = ppVar21;
                lVar34 = lVar19 + -1;
                lVar19 = lVar19 + -1;
                num_palette = num_palette + -1;
                ppVar21 = ppVar20 + -1;
              } while (maximum_colors <= (int)(uint)png_ptr->quantize_sort[lVar34]);
              pVar4 = ppVar20[-1].blue;
              pVar7 = ppVar21->red;
              pVar8 = ppVar21->green;
              ppVar20[-1].blue = palette[uVar29].blue;
              pVar6 = palette[uVar29].green;
              ppVar21->red = palette[uVar29].red;
              ppVar21->green = pVar6;
              palette[uVar29].red = pVar7;
              palette[uVar29].green = pVar8;
              palette[uVar29].blue = pVar4;
              png_ptr->quantize_index[lVar19] = (png_byte)uVar29;
              png_ptr->quantize_index[uVar29] = (png_byte)num_palette;
            }
          }
          for (uVar16 = 0; uVar16 != uVar12; uVar16 = uVar16 + 1) {
            bVar31 = png_ptr->quantize_index[uVar16];
            if (maximum_colors <= (int)(uint)bVar31) {
              uVar25 = (uint)palette[bVar31].red - (uint)palette->red;
              uVar18 = -uVar25;
              if (0 < (int)uVar25) {
                uVar18 = uVar25;
              }
              uVar35 = (uint)palette[bVar31].green - (uint)palette->green;
              uVar25 = -uVar35;
              if (0 < (int)uVar35) {
                uVar25 = uVar35;
              }
              uVar37 = (uint)palette[bVar31].blue - (uint)palette->blue;
              uVar35 = -uVar37;
              if (0 < (int)uVar37) {
                uVar35 = uVar37;
              }
              iVar9 = (uVar35 & 0xff) + (uVar25 & 0xff) + (uVar18 & 0xff);
              uVar38 = 0;
              ppVar36 = &palette[1].blue;
              for (lVar19 = 1; lVar19 < maximum_colors; lVar19 = lVar19 + 1) {
                iVar30 = (uint)palette[bVar31].red - (uint)((png_color *)(ppVar36 + -2))->red;
                iVar5 = -iVar30;
                if (0 < iVar30) {
                  iVar5 = iVar30;
                }
                iVar32 = (uint)palette[bVar31].green - (uint)ppVar36[-1];
                iVar30 = -iVar32;
                if (0 < iVar32) {
                  iVar30 = iVar32;
                }
                iVar33 = (uint)palette[bVar31].blue - (uint)*ppVar36;
                iVar32 = -iVar33;
                if (0 < iVar33) {
                  iVar32 = iVar33;
                }
                iVar32 = iVar32 + iVar30 + iVar5;
                if (iVar32 < iVar9) {
                  iVar9 = iVar32;
                  uVar38 = (int)lVar19;
                }
                ppVar36 = ppVar36 + 3;
              }
              png_ptr->quantize_index[uVar16] = (png_byte)uVar38;
            }
          }
        }
        else {
          uVar16 = 0;
          uVar12 = 0;
          if (0 < maximum_colors) {
            uVar12 = (ulong)(uint)maximum_colors;
          }
          for (; uVar16 != uVar12; uVar16 = uVar16 + 1) {
            if (maximum_colors <= (int)(uint)png_ptr->quantize_sort[uVar16]) {
              pbVar26 = png_ptr->quantize_sort + num_palette;
              ppVar21 = palette + num_palette;
              do {
                ppVar20 = ppVar21;
                pbVar26 = pbVar26 + -1;
                num_palette = num_palette + -1;
                ppVar21 = ppVar20 + -1;
              } while (maximum_colors <= (int)(uint)*pbVar26);
              palette[uVar16].blue = ppVar20[-1].blue;
              pVar4 = ppVar21->green;
              palette[uVar16].red = ppVar21->red;
              palette[uVar16].green = pVar4;
            }
          }
        }
        png_free(png_ptr,png_ptr->quantize_sort);
        png_ptr->quantize_sort = (png_bytep)0x0;
        num_palette = maximum_colors;
      }
    }
    if (png_ptr->palette == (png_colorp)0x0) {
      png_ptr->palette = palette;
    }
    png_ptr->num_palette = (png_uint_16)num_palette;
    if (full_quantize != 0) {
      ppVar11 = (png_bytep)png_calloc(png_ptr,0x8000);
      png_ptr->palette_lookup = ppVar11;
      pvVar14 = png_malloc(png_ptr,0x8000);
      memset(pvVar14,0xff,0x8000);
      uVar16 = 0;
      uVar12 = (ulong)(uint)num_palette;
      if (num_palette < 1) {
        uVar12 = uVar16;
      }
      for (; uVar16 != uVar12; uVar16 = uVar16 + 1) {
        bVar31 = palette[uVar16].red >> 3;
        uVar18 = (uint)(palette[uVar16].green >> 3);
        uVar25 = (uint)(palette[uVar16].blue >> 3);
        lVar19 = 0;
        for (uVar29 = 0; uVar29 != 0x20; uVar29 = uVar29 + 1) {
          uVar35 = (int)uVar29 - (uint)bVar31;
          if (uVar29 <= bVar31) {
            uVar35 = (uint)bVar31 - (int)uVar29;
          }
          lVar34 = lVar19;
          for (uVar22 = 0; uVar22 != 0x20; uVar22 = uVar22 + 1) {
            uVar37 = (int)uVar22 - uVar18;
            if (uVar22 <= uVar18) {
              uVar37 = uVar18 - (int)uVar22;
            }
            uVar10 = uVar37;
            if ((int)uVar37 < (int)uVar35) {
              uVar10 = uVar35;
            }
            uVar15 = uVar25;
            for (uVar27 = 0; uVar27 != 0x20; uVar27 = uVar27 + 1) {
              uVar28 = (int)uVar27 - uVar25;
              if (uVar27 <= uVar25) {
                uVar28 = uVar15;
              }
              uVar39 = uVar28;
              if ((int)uVar28 < (int)uVar10) {
                uVar39 = uVar10;
              }
              iVar9 = uVar28 + uVar37 + uVar35 + uVar39;
              if (iVar9 < (int)(uint)*(byte *)((long)pvVar14 + uVar27 + lVar34)) {
                *(char *)((long)pvVar14 + uVar27 + lVar34) = (char)iVar9;
                png_ptr->palette_lookup[uVar27 + lVar34] = (png_byte)uVar16;
              }
              uVar15 = uVar15 - 1;
            }
            lVar34 = lVar34 + 0x20;
          }
          lVar19 = lVar19 + 0x400;
        }
      }
      png_free(png_ptr,pvVar14);
      return;
    }
  }
  return;
LAB_00110e70:
  if (lVar19 == local_58) goto LAB_00110e20;
  puVar17 = *(undefined8 **)((long)pvVar14 + lVar19 * 8);
  if (puVar17 != (undefined8 *)0x0) {
    for (; puVar17 != (undefined8 *)0x0; puVar17 = (undefined8 *)*puVar17) {
      ppVar11 = *pppVar1;
      bVar31 = *(byte *)(puVar17 + 1);
      if (((int)(uint)ppVar11[bVar31] < num_palette) &&
         (bVar2 = *(byte *)((long)puVar17 + 9), (uint)ppVar11[bVar2] < (uint)num_palette)) {
        bVar24 = bVar31;
        if ((num_palette & 1U) == 0) {
          bVar24 = bVar2;
        }
        uVar18 = num_palette - 1;
        bVar3 = ppVar11[bVar24];
        palette[bVar3].blue = palette[uVar18].blue;
        pVar4 = palette[uVar18].green;
        palette[bVar3].red = palette[uVar18].red;
        palette[bVar3].green = pVar4;
        if (full_quantize == 0) {
          if ((num_palette & 1U) == 0) {
            bVar2 = bVar31;
          }
          for (uVar12 = 0; uVar16 != uVar12; uVar12 = uVar12 + 1) {
            ppVar11 = png_ptr->quantize_index;
            bVar31 = ppVar11[uVar12];
            if (bVar31 == png_ptr->index_to_palette[bVar24]) {
              ppVar11[uVar12] = png_ptr->index_to_palette[bVar2];
              ppVar11 = png_ptr->quantize_index;
              bVar31 = ppVar11[uVar12];
            }
            if (uVar18 == bVar31) {
              ppVar11[uVar12] = (*pppVar1)[bVar24];
            }
          }
          ppVar11 = *pppVar1;
        }
        ppVar11[png_ptr->palette_to_index[uVar18]] = ppVar11[bVar24];
        png_ptr->palette_to_index[png_ptr->index_to_palette[bVar24]] =
             png_ptr->palette_to_index[uVar18];
        png_ptr->index_to_palette[bVar24] = (png_byte)uVar18;
        png_ptr->palette_to_index[uVar18] = bVar24;
        num_palette = uVar18;
      }
      if (num_palette <= maximum_colors) break;
    }
    if (num_palette <= maximum_colors) goto LAB_00110e20;
  }
  lVar19 = lVar19 + 1;
  goto LAB_00110e70;
}

Assistant:

void PNGAPI
png_set_quantize(png_structrp png_ptr, png_colorp palette,
    int num_palette, int maximum_colors, png_const_uint_16p histogram,
    int full_quantize)
{
   png_debug(1, "in png_set_quantize");

   if (png_rtran_ok(png_ptr, 0) == 0)
      return;

   png_ptr->transformations |= PNG_QUANTIZE;

   if (full_quantize == 0)
   {
      int i;

      png_ptr->quantize_index = (png_bytep)png_malloc(png_ptr,
          (png_alloc_size_t)num_palette);
      for (i = 0; i < num_palette; i++)
         png_ptr->quantize_index[i] = (png_byte)i;
   }

   if (num_palette > maximum_colors)
   {
      if (histogram != NULL)
      {
         /* This is easy enough, just throw out the least used colors.
          * Perhaps not the best solution, but good enough.
          */

         int i;

         /* Initialize an array to sort colors */
         png_ptr->quantize_sort = (png_bytep)png_malloc(png_ptr,
             (png_alloc_size_t)num_palette);

         /* Initialize the quantize_sort array */
         for (i = 0; i < num_palette; i++)
            png_ptr->quantize_sort[i] = (png_byte)i;

         /* Find the least used palette entries by starting a
          * bubble sort, and running it until we have sorted
          * out enough colors.  Note that we don't care about
          * sorting all the colors, just finding which are
          * least used.
          */

         for (i = num_palette - 1; i >= maximum_colors; i--)
         {
            int done; /* To stop early if the list is pre-sorted */
            int j;

            done = 1;
            for (j = 0; j < i; j++)
            {
               if (histogram[png_ptr->quantize_sort[j]]
                   < histogram[png_ptr->quantize_sort[j + 1]])
               {
                  png_byte t;

                  t = png_ptr->quantize_sort[j];
                  png_ptr->quantize_sort[j] = png_ptr->quantize_sort[j + 1];
                  png_ptr->quantize_sort[j + 1] = t;
                  done = 0;
               }
            }

            if (done != 0)
               break;
         }

         /* Swap the palette around, and set up a table, if necessary */
         if (full_quantize != 0)
         {
            int j = num_palette;

            /* Put all the useful colors within the max, but don't
             * move the others.
             */
            for (i = 0; i < maximum_colors; i++)
            {
               if ((int)png_ptr->quantize_sort[i] >= maximum_colors)
               {
                  do
                     j--;
                  while ((int)png_ptr->quantize_sort[j] >= maximum_colors);

                  palette[i] = palette[j];
               }
            }
         }
         else
         {
            int j = num_palette;

            /* Move all the used colors inside the max limit, and
             * develop a translation table.
             */
            for (i = 0; i < maximum_colors; i++)
            {
               /* Only move the colors we need to */
               if ((int)png_ptr->quantize_sort[i] >= maximum_colors)
               {
                  png_color tmp_color;

                  do
                     j--;
                  while ((int)png_ptr->quantize_sort[j] >= maximum_colors);

                  tmp_color = palette[j];
                  palette[j] = palette[i];
                  palette[i] = tmp_color;
                  /* Indicate where the color went */
                  png_ptr->quantize_index[j] = (png_byte)i;
                  png_ptr->quantize_index[i] = (png_byte)j;
               }
            }

            /* Find closest color for those colors we are not using */
            for (i = 0; i < num_palette; i++)
            {
               if ((int)png_ptr->quantize_index[i] >= maximum_colors)
               {
                  int min_d, k, min_k, d_index;

                  /* Find the closest color to one we threw out */
                  d_index = png_ptr->quantize_index[i];
                  min_d = PNG_COLOR_DIST(palette[d_index], palette[0]);
                  for (k = 1, min_k = 0; k < maximum_colors; k++)
                  {
                     int d;

                     d = PNG_COLOR_DIST(palette[d_index], palette[k]);

                     if (d < min_d)
                     {
                        min_d = d;
                        min_k = k;
                     }
                  }
                  /* Point to closest color */
                  png_ptr->quantize_index[i] = (png_byte)min_k;
               }
            }
         }
         png_free(png_ptr, png_ptr->quantize_sort);
         png_ptr->quantize_sort = NULL;
      }
      else
      {
         /* This is much harder to do simply (and quickly).  Perhaps
          * we need to go through a median cut routine, but those
          * don't always behave themselves with only a few colors
          * as input.  So we will just find the closest two colors,
          * and throw out one of them (chosen somewhat randomly).
          * [We don't understand this at all, so if someone wants to
          *  work on improving it, be our guest - AED, GRP]
          */
         int i;
         int max_d;
         int num_new_palette;
         png_dsortp t;
         png_dsortpp hash;

         t = NULL;

         /* Initialize palette index arrays */
         png_ptr->index_to_palette = (png_bytep)png_malloc(png_ptr,
             (png_alloc_size_t)num_palette);
         png_ptr->palette_to_index = (png_bytep)png_malloc(png_ptr,
             (png_alloc_size_t)num_palette);

         /* Initialize the sort array */
         for (i = 0; i < num_palette; i++)
         {
            png_ptr->index_to_palette[i] = (png_byte)i;
            png_ptr->palette_to_index[i] = (png_byte)i;
         }

         hash = (png_dsortpp)png_calloc(png_ptr, (png_alloc_size_t)(769 *
             (sizeof (png_dsortp))));

         num_new_palette = num_palette;

         /* Initial wild guess at how far apart the farthest pixel
          * pair we will be eliminating will be.  Larger
          * numbers mean more areas will be allocated, Smaller
          * numbers run the risk of not saving enough data, and
          * having to do this all over again.
          *
          * I have not done extensive checking on this number.
          */
         max_d = 96;

         while (num_new_palette > maximum_colors)
         {
            for (i = 0; i < num_new_palette - 1; i++)
            {
               int j;

               for (j = i + 1; j < num_new_palette; j++)
               {
                  int d;

                  d = PNG_COLOR_DIST(palette[i], palette[j]);

                  if (d <= max_d)
                  {

                     t = (png_dsortp)png_malloc_warn(png_ptr,
                         (png_alloc_size_t)(sizeof (png_dsort)));

                     if (t == NULL)
                         break;

                     t->next = hash[d];
                     t->left = (png_byte)i;
                     t->right = (png_byte)j;
                     hash[d] = t;
                  }
               }
               if (t == NULL)
                  break;
            }

            if (t != NULL)
            for (i = 0; i <= max_d; i++)
            {
               if (hash[i] != NULL)
               {
                  png_dsortp p;

                  for (p = hash[i]; p; p = p->next)
                  {
                     if ((int)png_ptr->index_to_palette[p->left]
                         < num_new_palette &&
                         (int)png_ptr->index_to_palette[p->right]
                         < num_new_palette)
                     {
                        int j, next_j;

                        if (num_new_palette & 0x01)
                        {
                           j = p->left;
                           next_j = p->right;
                        }
                        else
                        {
                           j = p->right;
                           next_j = p->left;
                        }

                        num_new_palette--;
                        palette[png_ptr->index_to_palette[j]]
                            = palette[num_new_palette];
                        if (full_quantize == 0)
                        {
                           int k;

                           for (k = 0; k < num_palette; k++)
                           {
                              if (png_ptr->quantize_index[k] ==
                                  png_ptr->index_to_palette[j])
                                 png_ptr->quantize_index[k] =
                                     png_ptr->index_to_palette[next_j];

                              if ((int)png_ptr->quantize_index[k] ==
                                  num_new_palette)
                                 png_ptr->quantize_index[k] =
                                     png_ptr->index_to_palette[j];
                           }
                        }

                        png_ptr->index_to_palette[png_ptr->palette_to_index
                            [num_new_palette]] = png_ptr->index_to_palette[j];

                        png_ptr->palette_to_index[png_ptr->index_to_palette[j]]
                            = png_ptr->palette_to_index[num_new_palette];

                        png_ptr->index_to_palette[j] =
                            (png_byte)num_new_palette;

                        png_ptr->palette_to_index[num_new_palette] =
                            (png_byte)j;
                     }
                     if (num_new_palette <= maximum_colors)
                        break;
                  }
                  if (num_new_palette <= maximum_colors)
                     break;
               }
            }

            for (i = 0; i < 769; i++)
            {
               if (hash[i] != NULL)
               {
                  png_dsortp p = hash[i];
                  while (p)
                  {
                     t = p->next;
                     png_free(png_ptr, p);
                     p = t;
                  }
               }
               hash[i] = 0;
            }
            max_d += 96;
         }
         png_free(png_ptr, hash);
         png_free(png_ptr, png_ptr->palette_to_index);
         png_free(png_ptr, png_ptr->index_to_palette);
         png_ptr->palette_to_index = NULL;
         png_ptr->index_to_palette = NULL;
      }
      num_palette = maximum_colors;
   }
   if (png_ptr->palette == NULL)
   {
      png_ptr->palette = palette;
   }
   png_ptr->num_palette = (png_uint_16)num_palette;

   if (full_quantize != 0)
   {
      int i;
      png_bytep distance;
      int total_bits = PNG_QUANTIZE_RED_BITS + PNG_QUANTIZE_GREEN_BITS +
          PNG_QUANTIZE_BLUE_BITS;
      int num_red = (1 << PNG_QUANTIZE_RED_BITS);
      int num_green = (1 << PNG_QUANTIZE_GREEN_BITS);
      int num_blue = (1 << PNG_QUANTIZE_BLUE_BITS);
      size_t num_entries = ((size_t)1 << total_bits);

      png_ptr->palette_lookup = (png_bytep)png_calloc(png_ptr,
          (png_alloc_size_t)(num_entries));

      distance = (png_bytep)png_malloc(png_ptr, (png_alloc_size_t)num_entries);

      memset(distance, 0xff, num_entries);

      for (i = 0; i < num_palette; i++)
      {
         int ir, ig, ib;
         int r = (palette[i].red >> (8 - PNG_QUANTIZE_RED_BITS));
         int g = (palette[i].green >> (8 - PNG_QUANTIZE_GREEN_BITS));
         int b = (palette[i].blue >> (8 - PNG_QUANTIZE_BLUE_BITS));

         for (ir = 0; ir < num_red; ir++)
         {
            /* int dr = abs(ir - r); */
            int dr = ((ir > r) ? ir - r : r - ir);
            int index_r = (ir << (PNG_QUANTIZE_BLUE_BITS +
                PNG_QUANTIZE_GREEN_BITS));

            for (ig = 0; ig < num_green; ig++)
            {
               /* int dg = abs(ig - g); */
               int dg = ((ig > g) ? ig - g : g - ig);
               int dt = dr + dg;
               int dm = ((dr > dg) ? dr : dg);
               int index_g = index_r | (ig << PNG_QUANTIZE_BLUE_BITS);

               for (ib = 0; ib < num_blue; ib++)
               {
                  int d_index = index_g | ib;
                  /* int db = abs(ib - b); */
                  int db = ((ib > b) ? ib - b : b - ib);
                  int dmax = ((dm > db) ? dm : db);
                  int d = dmax + dt + db;

                  if (d < (int)distance[d_index])
                  {
                     distance[d_index] = (png_byte)d;
                     png_ptr->palette_lookup[d_index] = (png_byte)i;
                  }
               }
            }
         }
      }

      png_free(png_ptr, distance);
   }
}